

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_ticket.c
# Opt level: O0

int mbedtls_ssl_ticket_parse(void *p_ticket,mbedtls_ssl_session *session,uchar *buf,size_t len)

{
  time_t tVar1;
  mbedtls_time_t current_time;
  size_t clear_len;
  size_t enc_len;
  uchar *tag;
  uchar *ticket;
  uchar *enc_len_p;
  uchar *iv;
  uchar *key_name;
  mbedtls_ssl_ticket_key *key;
  mbedtls_ssl_ticket_context *ctx;
  size_t sStack_38;
  int ret;
  size_t len_local;
  uchar *buf_local;
  mbedtls_ssl_session *session_local;
  void *p_ticket_local;
  
  enc_len_p = buf + 4;
  ticket = buf + 0x10;
  tag = buf + 0x12;
  if ((p_ticket == (void *)0x0) || (*(long *)((long)p_ticket + 200) == 0)) {
    p_ticket_local._4_4_ = -0x7100;
  }
  else if (len < 0x22) {
    p_ticket_local._4_4_ = -0x7100;
  }
  else {
    iv = buf;
    key = (mbedtls_ssl_ticket_key *)p_ticket;
    sStack_38 = len;
    len_local = (size_t)buf;
    buf_local = (uchar *)session;
    session_local = (mbedtls_ssl_session *)p_ticket;
    ctx._4_4_ = ssl_ticket_update_keys((mbedtls_ssl_ticket_context *)p_ticket);
    if (ctx._4_4_ == 0) {
      clear_len = (size_t)(int)(uint)CONCAT11(*ticket,ticket[1]);
      enc_len = (size_t)(tag + clear_len);
      if (sStack_38 == clear_len + 0x22) {
        key_name = ssl_ticket_select_key((mbedtls_ssl_ticket_context *)key,iv)->name;
        if ((mbedtls_ssl_ticket_key *)key_name == (mbedtls_ssl_ticket_key *)0x0) {
          ctx._4_4_ = -0x6d80;
        }
        else {
          ctx._4_4_ = mbedtls_cipher_auth_decrypt
                                (&((mbedtls_ssl_ticket_key *)key_name)->ctx,enc_len_p,0xc,iv,0x12,
                                 tag,clear_len,tag,(size_t *)&current_time,(uchar *)enc_len,0x10);
          if (ctx._4_4_ == 0) {
            if (current_time == clear_len) {
              ctx._4_4_ = ssl_load_session((mbedtls_ssl_session *)buf_local,tag,current_time);
              if ((ctx._4_4_ == 0) &&
                 ((tVar1 = time((time_t *)0x0), tVar1 < *(long *)buf_local ||
                  (key[2].generation_time < (uint)((int)tVar1 - (int)*(undefined8 *)buf_local))))) {
                ctx._4_4_ = -0x6d80;
              }
            }
            else {
              ctx._4_4_ = -0x6c00;
            }
          }
          else if (ctx._4_4_ == -0x6300) {
            ctx._4_4_ = -0x7180;
          }
        }
      }
      else {
        ctx._4_4_ = -0x7100;
      }
    }
    p_ticket_local._4_4_ = ctx._4_4_;
  }
  return p_ticket_local._4_4_;
}

Assistant:

int mbedtls_ssl_ticket_parse( void *p_ticket,
                              mbedtls_ssl_session *session,
                              unsigned char *buf,
                              size_t len )
{
    int ret;
    mbedtls_ssl_ticket_context *ctx = p_ticket;
    mbedtls_ssl_ticket_key *key;
    unsigned char *key_name = buf;
    unsigned char *iv = buf + 4;
    unsigned char *enc_len_p = iv + 12;
    unsigned char *ticket = enc_len_p + 2;
    unsigned char *tag;
    size_t enc_len, clear_len;

    if( ctx == NULL || ctx->f_rng == NULL )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

    /* See mbedtls_ssl_ticket_write() */
    if( len < 4 + 12 + 2 + 16 )
        return( MBEDTLS_ERR_SSL_BAD_INPUT_DATA );

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &ctx->mutex ) ) != 0 )
        return( ret );
#endif

    if( ( ret = ssl_ticket_update_keys( ctx ) ) != 0 )
        goto cleanup;

    enc_len = ( enc_len_p[0] << 8 ) | enc_len_p[1];
    tag = ticket + enc_len;

    if( len != 4 + 12 + 2 + enc_len + 16 )
    {
        ret = MBEDTLS_ERR_SSL_BAD_INPUT_DATA;
        goto cleanup;
    }

    /* Select key */
    if( ( key = ssl_ticket_select_key( ctx, key_name ) ) == NULL )
    {
        /* We can't know for sure but this is a likely option unless we're
         * under attack - this is only informative anyway */
        ret = MBEDTLS_ERR_SSL_SESSION_TICKET_EXPIRED;
        goto cleanup;
    }

    /* Decrypt and authenticate */
    if( ( ret = mbedtls_cipher_auth_decrypt( &key->ctx, iv, 12,
                    key_name, 4 + 12 + 2, ticket, enc_len,
                    ticket, &clear_len, tag, 16 ) ) != 0 )
    {
        if( ret == MBEDTLS_ERR_CIPHER_AUTH_FAILED )
            ret = MBEDTLS_ERR_SSL_INVALID_MAC;

        goto cleanup;
    }
    if( clear_len != enc_len )
    {
        ret = MBEDTLS_ERR_SSL_INTERNAL_ERROR;
        goto cleanup;
    }

    /* Actually load session */
    if( ( ret = ssl_load_session( session, ticket, clear_len ) ) != 0 )
        goto cleanup;

#if defined(MBEDTLS_HAVE_TIME)
    {
        /* Check for expiration */
        mbedtls_time_t current_time = mbedtls_time( NULL );

        if( current_time < session->start ||
            (uint32_t)( current_time - session->start ) > ctx->ticket_lifetime )
        {
            ret = MBEDTLS_ERR_SSL_SESSION_TICKET_EXPIRED;
            goto cleanup;
        }
    }
#endif

cleanup:
#if defined(MBEDTLS_THREADING_C)
    if( mbedtls_mutex_unlock( &ctx->mutex ) != 0 )
        return( MBEDTLS_ERR_THREADING_MUTEX_ERROR );
#endif

    return( ret );
}